

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlDoErrValid(xmlValidCtxtPtr ctxt,xmlNodePtr node,xmlParserErrors code,int level,xmlChar *str1
                  ,xmlChar *str2,xmlChar *str3,int int1,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [48];
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (ctxt != (xmlValidCtxtPtr)0x0) {
    if ((ctxt->flags & 2) != 0) {
      ap[0].reg_save_area = local_c8;
      ap[0].overflow_arg_area = &stack0x00000020;
      ap[0].gp_offset = 0x30;
      ap[0].fp_offset = 0x30;
      if ((xmlParserCtxtPtr)ctxt->userData != (xmlParserCtxtPtr)0x0) {
        xmlCtxtVErr((xmlParserCtxtPtr)ctxt->userData,node,XML_FROM_VALID,code,level,str1,str2,str3,
                    int1,msg,ap);
        return;
      }
    }
    ap[0].reg_save_area = local_c8;
    ap[0].overflow_arg_area = &stack0x00000020;
    ap[0].gp_offset = 0x30;
    ap[0].fp_offset = 0x30;
    iVar1 = xmlVRaiseError((xmlStructuredErrorFunc)0x0,ctxt->error,ctxt->userData,(void *)0x0,node,
                           0x17,code,level,(char *)0x0,0,(char *)str1,(char *)str2,(char *)str2,int1
                           ,0,msg,ap);
    if (iVar1 < 0) {
      xmlVErrMemory(ctxt);
    }
  }
  return;
}

Assistant:

static void
xmlDoErrValid(xmlValidCtxtPtr ctxt, xmlNodePtr node,
              xmlParserErrors code, int level,
              const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
              int int1,
              const char *msg, ...) {
    xmlParserCtxtPtr pctxt = NULL;
    va_list ap;

    if (ctxt == NULL)
        return;
    if (ctxt->flags & XML_VCTXT_USE_PCTXT)
        pctxt = ctxt->userData;

    va_start(ap, msg);
    if (pctxt != NULL) {
        xmlCtxtVErr(pctxt, node, XML_FROM_VALID, code, level,
                    str1, str2, str3, int1, msg, ap);
    } else {
        xmlGenericErrorFunc channel = NULL;
        void *data = NULL;
        int res;

        if (ctxt != NULL) {
            channel = ctxt->error;
            data = ctxt->userData;
        }
        res = xmlVRaiseError(NULL, channel, data, NULL, node,
                             XML_FROM_VALID, code, level, NULL, 0,
                             (const char *) str1, (const char *) str2,
                             (const char *) str2, int1, 0,
                             msg, ap);
        if (res < 0)
            xmlVErrMemory(ctxt);
    }
    va_end(ap);
}